

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool __thiscall
tinyusdz::InheritPrimSpec(tinyusdz *this,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  _Rb_tree_node_base *__k;
  PrimSpec *pPVar1;
  PrimSpec *pPVar2;
  bool bVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  PrimSpec *child;
  PrimSpec *dst_00;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it_00;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  src_00;
  bool bVar8;
  PrimSpec ps;
  PrimSpec *local_5a0;
  undefined1 local_598 [40];
  string local_570 [32];
  PrimSpec *local_550;
  PrimSpec *local_548;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_538 [4];
  PrimMetas local_460;
  
  PrimSpec::PrimSpec((PrimSpec *)local_598,dst);
  ::std::__cxx11::string::_M_assign(local_570);
  if (*(long *)(this + 0x10) != 0) {
    ::std::__cxx11::string::_M_assign((string *)(local_598 + 8));
  }
  local_598._0_4_ = *(undefined4 *)this;
  PrimMetas::update_from(&local_460,(PrimMetas *)(this + 0x138),true);
  p_Var6 = *(_Rb_tree_node_base **)(this + 0x78);
  dst_00 = local_550;
  pPVar2 = local_548;
  while (p_Var6 != (_Rb_tree_node_base *)(this + 0x68)) {
    __k = p_Var6 + 1;
    local_550 = dst_00;
    local_548 = pPVar2;
    cVar4 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::find(local_538,(key_type *)__k);
    if ((_Rb_tree_header *)cVar4._M_node == &local_538[0]._M_impl.super__Rb_tree_header) {
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                             *)local_538,(key_type *)__k);
    }
    else {
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)local_538,(key_type *)__k);
    }
    ::std::__cxx11::string::_M_assign((string *)pmVar5);
    (pmVar5->_attrib)._varying_authored = (bool)p_Var6[3].field_0x4;
    (pmVar5->_attrib)._variability = p_Var6[3]._M_color;
    ::std::__cxx11::string::_M_assign((string *)&(pmVar5->_attrib)._type_name);
    linb::any::operator=((any *)&(pmVar5->_attrib)._var,(any *)&p_Var6[4]._M_parent);
    (pmVar5->_attrib)._var._blocked = SUB41(p_Var6[5]._M_color,0);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=(&(pmVar5->_attrib)._var._ts._samples,
                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&p_Var6[5]._M_parent);
    (pmVar5->_attrib)._var._ts._dirty = SUB41(p_Var6[6]._M_color,0);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&(pmVar5->_attrib)._paths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var6[6]._M_parent);
    AttrMetas::operator=(&(pmVar5->_attrib)._metas,(AttrMetas *)(p_Var6 + 7));
    *(_Base_ptr *)&pmVar5->_listOpQual = p_Var6[0x17]._M_parent;
    (pmVar5->_rel).type = *(Type *)&p_Var6[0x17]._M_left;
    Path::operator=(&(pmVar5->_rel).targetPath,(Path *)&p_Var6[0x17]._M_right);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &(pmVar5->_rel).targetPathVector,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var6[0x1e]._M_parent);
    (pmVar5->_rel).listOpQual = p_Var6[0x1f]._M_color;
    AttrMetas::operator=(&(pmVar5->_rel)._metas,(AttrMetas *)&p_Var6[0x1f]._M_parent);
    (pmVar5->_rel)._varying_authored = *(bool *)&p_Var6[0x2f]._M_left;
    ::std::__cxx11::string::_M_assign((string *)&pmVar5->_prop_value_type_name);
    pmVar5->_has_custom = *(bool *)&p_Var6[0x30]._M_right;
    p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6);
    dst_00 = local_550;
    pPVar2 = local_548;
  }
  bVar8 = dst_00 == pPVar2;
  if (!bVar8) {
    bVar8 = false;
    do {
      __it._M_current = *(PrimSpec **)(this + 0x48);
      pPVar1 = *(PrimSpec **)(this + 0x50);
      lVar7 = ((long)pPVar1 - (long)__it._M_current >> 3) * -0x77dc7c4cf2ae9cdb >> 2;
      __it_00._M_current = __it._M_current;
      local_5a0 = dst_00;
      if (0 < lVar7) {
        __it_00._M_current = __it._M_current + lVar7 * 4;
        lVar7 = lVar7 + 1;
        do {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                  ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                *)&local_5a0,__it);
          src_00._M_current = __it._M_current;
          if (bVar3) goto LAB_001b128c;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                  ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                *)&local_5a0,__it._M_current + 1);
          src_00._M_current = __it._M_current + 1;
          if (bVar3) goto LAB_001b128c;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                  ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                *)&local_5a0,__it._M_current + 2);
          src_00._M_current = __it._M_current + 2;
          if (bVar3) goto LAB_001b128c;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                  ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                *)&local_5a0,__it._M_current + 3);
          src_00._M_current = __it._M_current + 3;
          if (bVar3) goto LAB_001b128c;
          __it._M_current = __it._M_current + 4;
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
      }
      lVar7 = ((long)pPVar1 - (long)__it_00._M_current >> 3) * -0x77dc7c4cf2ae9cdb;
      if (lVar7 == 1) {
LAB_001b1275:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                              *)&local_5a0,__it_00);
        src_00._M_current = __it_00._M_current;
        if (!bVar3) {
          src_00._M_current = pPVar1;
        }
      }
      else if (lVar7 == 2) {
LAB_001b1252:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                              *)&local_5a0,__it_00);
        src_00._M_current = __it_00._M_current;
        if (!bVar3) {
          __it_00._M_current = __it_00._M_current + 1;
          goto LAB_001b1275;
        }
      }
      else {
        src_00._M_current = pPVar1;
        if ((lVar7 == 3) &&
           (bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)&local_5a0,__it_00), src_00._M_current = __it_00._M_current,
           !bVar3)) {
          __it_00._M_current = __it_00._M_current + 1;
          goto LAB_001b1252;
        }
      }
LAB_001b128c:
      if ((src_00._M_current != pPVar1) &&
         (bVar3 = detail::OverridePrimSpecRec(1,dst_00,src_00._M_current,warn,err), !bVar3))
      goto LAB_001b12dc;
      dst_00 = dst_00 + 1;
      bVar8 = dst_00 == pPVar2;
    } while (!bVar8);
  }
  if ((tinyusdz *)local_598 != this) {
    PrimSpec::MoveFrom((PrimSpec *)this,(PrimSpec *)local_598);
  }
LAB_001b12dc:
  PrimSpec::~PrimSpec((PrimSpec *)local_598);
  return bVar8;
}

Assistant:

bool InheritPrimSpec(PrimSpec &dst, const PrimSpec &src, std::string *warn,
                     std::string *err) {
  return detail::InheritPrimSpecImpl(dst, src, warn, err);
}